

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O1

void __thiscall wabt::OptionParser::Parse(OptionParser *this,int argc,char **argv)

{
  pointer pOVar1;
  bool bVar2;
  int iVar3;
  pointer pAVar4;
  char *pcVar5;
  bool bVar6;
  long lVar7;
  size_t sVar8;
  bool *pbVar9;
  char *pcVar10;
  pointer pOVar11;
  int iVar12;
  pointer pOVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  size_t arg_index;
  int local_64;
  size_t local_50;
  char *local_48;
  char *local_40;
  pointer local_38;
  
  local_50 = 0;
  if (1 < argc) {
    iVar16 = 1;
    do {
      pcVar5 = argv[iVar16];
      if ((*pcVar5 == '-') && (pcVar5[1] != '\0')) {
        local_40 = pcVar5;
        if (pcVar5[1] == '-') {
          pOVar11 = (this->options_).
                    super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar7 = (long)(this->options_).
                        super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar11;
          if (lVar7 == 0) {
            lVar7 = -1;
            iVar14 = 0;
            lVar15 = 0;
          }
          else {
            lVar7 = (lVar7 >> 4) * -0x71c71c71c71c71c7;
            pbVar9 = &pOVar11->has_argument;
            iVar12 = 0;
            local_64 = -1;
            iVar14 = 0;
            lVar15 = 0;
            local_38 = pOVar11;
            do {
              if (*(size_type *)(pbVar9 + -0x38) != 0) {
                iVar3 = Match(pcVar5 + 2,(string *)(pbVar9 + -0x40),*pbVar9);
                if (iVar12 < iVar3) {
                  iVar14 = 1;
                  local_64 = (int)lVar15;
                  iVar12 = iVar3;
                }
                else {
                  iVar14 = iVar14 + (uint)(0 < iVar12 && iVar3 == iVar12);
                }
              }
              lVar15 = lVar15 + 1;
              pbVar9 = pbVar9 + 0x90;
            } while (lVar7 + (ulong)(lVar7 == 0) != lVar15);
            lVar7 = (long)local_64;
            lVar15 = (long)iVar12;
            pOVar11 = local_38;
          }
          pcVar5 = local_40;
          if (iVar14 < 2) {
            if (iVar14 != 0) {
              iVar14 = iVar16;
              if (pOVar11[lVar7].has_argument == true) {
                if ((local_40[lVar15 + 1] == '\0') || (local_40[lVar15 + 2] != '=')) {
                  iVar14 = iVar16 + 1;
                  if ((iVar14 == argc) || (pcVar5 = argv[iVar14], *pcVar5 == '-')) {
                    pcVar10 = "option \'--%s\' requires argument";
                    pcVar5 = pOVar11[lVar7].long_name._M_dataplus._M_p;
                    goto LAB_0015ce69;
                  }
                }
                else {
                  pcVar5 = local_40 + lVar15 + 3;
                }
              }
              else {
                pcVar5 = (char *)0x0;
              }
              iVar16 = iVar14;
              local_48 = pcVar5;
              if (pOVar11[lVar7].callback.super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_0015cefd:
                std::__throw_bad_function_call();
              }
              (*pOVar11[lVar7].callback._M_invoker)((_Any_data *)&pOVar11[lVar7].callback,&local_48)
              ;
              goto LAB_0015cc72;
            }
            pcVar10 = "unknown option \'%s\'";
          }
          else {
            pcVar10 = "ambiguous option \'%s\'";
          }
LAB_0015ce69:
          Errorf(this,pcVar10,pcVar5);
        }
        else if (pcVar5[1] != '\0') {
          pcVar5 = pcVar5 + 1;
          lVar7 = 1;
          do {
            pOVar11 = (this->options_).
                      super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pOVar1 = (this->options_).
                     super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (pOVar11 == pOVar1) {
              bVar6 = false;
            }
            else {
              bVar6 = false;
              do {
                pOVar13 = pOVar11 + 1;
                if ((pOVar11->short_name == '\0') || (*pcVar5 != pOVar11->short_name)) {
                  bVar2 = false;
                }
                else if (pOVar11->has_argument == true) {
                  if (pcVar5[1] == '\0') {
                    iVar14 = iVar16 + 1;
                    if ((iVar14 != argc) && (pcVar10 = argv[iVar14], *pcVar10 != '-'))
                    goto LAB_0015cd05;
                    Errorf(this,"option \'-%c\' requires argument");
                    bVar2 = true;
                  }
                  else {
                    Errorf(this,"option \'-%c\' requires argument");
                    bVar2 = true;
                  }
                }
                else {
                  pcVar10 = (char *)0x0;
                  iVar14 = iVar16;
LAB_0015cd05:
                  local_48 = pcVar10;
                  if ((pOVar11->callback).super__Function_base._M_manager == (_Manager_type)0x0)
                  goto LAB_0015cefd;
                  (*(pOVar11->callback)._M_invoker)((_Any_data *)&pOVar11->callback,&local_48);
                  bVar6 = true;
                  bVar2 = true;
                  iVar16 = iVar14;
                }
              } while ((!bVar2) && (pOVar11 = pOVar13, pOVar13 != pOVar1));
            }
            pcVar10 = local_40;
            if (!bVar6) {
              Errorf(this,"unknown option \'-%c\'",(ulong)(uint)(int)*pcVar5);
            }
            pcVar5 = pcVar10 + lVar7 + 1;
            lVar7 = lVar7 + 1;
          } while (*pcVar5 != '\0');
        }
      }
      else {
        HandleArgument(this,&local_50,pcVar5);
      }
LAB_0015cc72:
      iVar16 = iVar16 + 1;
    } while (iVar16 < argc);
  }
  pAVar4 = (this->arguments_).
           super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((((this->arguments_).
        super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
        ._M_impl.super__Vector_impl_data._M_start != pAVar4) && (pAVar4[-1].handled_count == 0)) &&
     (pAVar4 = (this->arguments_).
               super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
               ._M_impl.super__Vector_impl_data._M_start,
     local_50 <
     (ulong)(((long)(this->arguments_).
                    super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar4 >> 4) *
            -0x3333333333333333))) {
    lVar7 = local_50 * 0x50;
    sVar8 = local_50;
    do {
      Errorf(this,"expected %s argument.",
             *(undefined8 *)((long)&(pAVar4->name)._M_dataplus._M_p + lVar7));
      sVar8 = sVar8 + 1;
      pAVar4 = (this->arguments_).
               super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x50;
    } while (sVar8 < (ulong)(((long)(this->arguments_).
                                    super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar4 >> 4)
                            * -0x3333333333333333));
  }
  return;
}

Assistant:

void OptionParser::Parse(int argc, char* argv[]) {
  size_t arg_index = 0;

  for (int i = 1; i < argc; ++i) {
    const char* arg = argv[i];
    if (arg[0] == '-') {
      if (arg[1] == '-') {
        // Long option.
        int best_index = -1;
        int best_length = 0;
        int best_count = 0;
        for (size_t j = 0; j < options_.size(); ++j) {
          const Option& option = options_[j];
          if (!option.long_name.empty()) {
            int match_length =
                Match(&arg[2], option.long_name, option.has_argument);
            if (match_length > best_length) {
              best_index = j;
              best_length = match_length;
              best_count = 1;
            } else if (match_length == best_length && best_length > 0) {
              best_count++;
            }
          }
        }

        if (best_count > 1) {
          Errorf("ambiguous option '%s'", arg);
          continue;
        } else if (best_count == 0) {
          Errorf("unknown option '%s'", arg);
          continue;
        }

        const Option& best_option = options_[best_index];
        const char* option_argument = nullptr;
        if (best_option.has_argument) {
          if (arg[best_length + 1] != 0 &&    // This byte is 0 on a full match.
              arg[best_length + 2] == '=') {  // +2 to skip "--".
            option_argument = &arg[best_length + 3];
          } else {
            if (i + 1 == argc || argv[i + 1][0] == '-') {
              Errorf("option '--%s' requires argument",
                     best_option.long_name.c_str());
              continue;
            }
            ++i;
            option_argument = argv[i];
          }
        }
        best_option.callback(option_argument);
      } else {
        // Short option.
        if (arg[1] == '\0') {
          // Just "-".
          HandleArgument(&arg_index, arg);
          continue;
        }

        // Allow short names to be combined, e.g. "-d -v" => "-dv".
        for (int k = 1; arg[k]; ++k) {
          bool matched = false;
          for (const Option& option : options_) {
            if (option.short_name && arg[k] == option.short_name) {
              const char* option_argument = nullptr;
              if (option.has_argument) {
                // A short option with a required argument cannot be followed
                // by other short options_.
                if (arg[k + 1] != '\0') {
                  Errorf("option '-%c' requires argument", option.short_name);
                  break;
                }

                if (i + 1 == argc || argv[i + 1][0] == '-') {
                  Errorf("option '-%c' requires argument", option.short_name);
                  break;
                }
                ++i;
                option_argument = argv[i];
              }
              option.callback(option_argument);
              matched = true;
              break;
            }
          }

          if (!matched) {
            Errorf("unknown option '-%c'", arg[k]);
            continue;
          }
        }
      }
    } else {
      // Non-option argument.
      HandleArgument(&arg_index, arg);
    }
  }

  // For now, all arguments must be provided. Check that the last Argument was
  // handled at least once.
  if (!arguments_.empty() && arguments_.back().handled_count == 0) {
    for (size_t i = arg_index; i < arguments_.size(); ++i) {
      Errorf("expected %s argument.", arguments_[i].name.c_str());
    }
  }
}